

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DAG.h
# Opt level: O2

void __thiscall DAGNode::DAGNode(DAGNode *this,int label,string *op,int left,int right)

{
  allocator local_21;
  
  this->label = label;
  std::__cxx11::string::string((string *)&this->op,(string *)op);
  std::__cxx11::string::string((string *)&this->mainMark,"",&local_21);
  (this->addMarks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->addMarks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->addMarks).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->left = left;
  this->right = right;
  this->isDeleted = false;
  return;
}

Assistant:

DAGNode(int label, string op, int left, int right): label(label), mainMark(""), op(op), left(left),
                                                    right(right), addMarks(), isDeleted(false){}